

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_ISTORE(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *this_00;
  void *this_01;
  ostream *in_RSI;
  long in_RDI;
  int srcIndex;
  int dstIndex;
  
  bVar1 = *(byte *)(in_RDI + 2);
  genAddressRegDst(this,os,dstIndex);
  this_00 = std::operator<<(in_RSI,", r");
  this_01 = (void *)std::ostream::operator<<(this_00,(uint)bVar1 % 8);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void  Instruction::h_ISTORE(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		genAddressRegDst(os, dstIndex);
		os << ", r" << srcIndex << std::endl;
	}